

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# AbstractNumericValidator.cpp
# Opt level: O3

XMLCh * __thiscall
xercesc_4_0::AbstractNumericValidator::getCanonicalRepresentation
          (AbstractNumericValidator *this,XMLCh *rawData,MemoryManager *memMgr,bool toValidate)

{
  XMLCh *pXVar1;
  undefined7 in_register_00000009;
  
  if (memMgr == (MemoryManager *)0x0) {
    memMgr = (this->super_AbstractNumericFacetValidator).super_DatatypeValidator.fMemoryManager;
  }
  if ((int)CONCAT71(in_register_00000009,toValidate) != 0) {
    (*(this->super_AbstractNumericFacetValidator).super_DatatypeValidator.super_XSerializable.
      _vptr_XSerializable[0x11])(this,rawData,0,0,memMgr);
  }
  pXVar1 = XMLAbstractDoubleFloat::getCanonicalRepresentation(rawData,memMgr);
  return pXVar1;
}

Assistant:

const XMLCh* AbstractNumericValidator::getCanonicalRepresentation(const XMLCh*         const rawData
                                                                 ,      MemoryManager* const memMgr
                                                                 ,      bool                 toValidate) const
{
    MemoryManager* toUse = memMgr? memMgr : fMemoryManager;

    if (toValidate)
    {
        AbstractNumericValidator* temp = (AbstractNumericValidator*) this;

        try 
        {
            temp->checkContent(rawData, 0, false, toUse);
        }
        catch (...)
        {
            return 0;
        }
    }

    // XMLAbstractDoubleFloat::getCanonicalRepresentation handles
    // exceptional cases
    return XMLAbstractDoubleFloat::getCanonicalRepresentation(rawData, toUse);

}